

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ImplicitWeakMessage::ByteSizeLong(ImplicitWeakMessage *this)

{
  int iVar1;
  size_t sVar2;
  
  if (this->data_ == (string *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = this->data_->_M_string_length;
    iVar1 = (int)sVar2;
    if (iVar1 != 0) goto LAB_0022793d;
  }
  iVar1 = 0;
  if ((this->cached_size_).atom_ == 0) {
    return sVar2;
  }
LAB_0022793d:
  (this->cached_size_).atom_ = iVar1;
  return sVar2;
}

Assistant:

size_t ByteSizeLong() const PROTOBUF_FINAL {
    size_t size = data_ == nullptr ? 0 : data_->size();
    cached_size_.Set(internal::ToCachedSize(size));
    return size;
  }